

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void SplitBlock(CPpmd8 *p,void *ptr,uint oldIndx,uint newIndx)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = (uint)p->Indx2Units[oldIndx] - (uint)p->Indx2Units[newIndx];
  puVar1 = (undefined4 *)((long)ptr + (ulong)p->Indx2Units[newIndx] * 0xc);
  uVar3 = (ulong)p->Units2Indx[uVar4 - 1];
  if (uVar4 != p->Indx2Units[uVar3]) {
    uVar3 = (ulong)(p->Units2Indx[uVar4 - 1] - 1);
    puVar2 = puVar1 + (ulong)p->Indx2Units[uVar3] * 3;
    uVar4 = uVar4 + ~(uint)p->Indx2Units[uVar3];
    *puVar2 = 0xffffffff;
    puVar2[1] = p->FreeList[uVar4];
    puVar2[2] = (uint)p->Indx2Units[uVar4];
    p->FreeList[uVar4] = (int)puVar2 - *(int *)&p->Base;
    p->Stamps[uVar4] = p->Stamps[uVar4] + 1;
  }
  *puVar1 = 0xffffffff;
  puVar1[1] = p->FreeList[uVar3];
  puVar1[2] = (uint)p->Indx2Units[uVar3];
  p->FreeList[uVar3] = (int)puVar1 - *(int *)&p->Base;
  p->Stamps[uVar3] = p->Stamps[uVar3] + 1;
  return;
}

Assistant:

static void SplitBlock(CPpmd8 *p, void *ptr, unsigned oldIndx, unsigned newIndx)
{
  unsigned i, nu = I2U(oldIndx) - I2U(newIndx);
  ptr = (Byte *)ptr + U2B(I2U(newIndx));
  if (I2U(i = U2I(nu)) != nu)
  {
    unsigned k = I2U(--i);
    InsertNode(p, ((Byte *)ptr) + U2B(k), nu - k - 1);
  }
  InsertNode(p, ptr, i);
}